

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

void parseTzLeapSeconds(QDataStream *ds,int tzh_leapcnt,bool longTran)

{
  Status SVar1;
  undefined3 in_register_00000011;
  int iVar2;
  long in_FS_OFFSET;
  bool bVar3;
  qint64 time;
  qint32 val;
  undefined1 *local_38;
  qint32 local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = -0x55555556;
  if (CONCAT31(in_register_00000011,longTran) == 0) {
    iVar2 = 0;
    if (0 < tzh_leapcnt) {
      iVar2 = tzh_leapcnt;
    }
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      SVar1 = QDataStream::status(ds);
      if (SVar1 != Ok) break;
      QDataStream::operator>>(ds,&local_2c);
      SVar1 = QDataStream::status(ds);
      if (SVar1 == Ok) {
        QDataStream::operator>>(ds,&local_2c);
      }
    }
  }
  else {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    iVar2 = 0;
    if (0 < tzh_leapcnt) {
      iVar2 = tzh_leapcnt;
    }
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      SVar1 = QDataStream::status(ds);
      if (SVar1 != Ok) break;
      QDataStream::operator>>(ds,(qint64 *)&local_38);
      SVar1 = QDataStream::status(ds);
      if (SVar1 == Ok) {
        QDataStream::operator>>(ds,&local_2c);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void parseTzLeapSeconds(QDataStream &ds, int tzh_leapcnt, bool longTran)
{
    // Parse tzh_leapcnt x pairs of leap seconds
    // We don't use leap seconds, so only read and don't store
    qint32 val;
    if (longTran) {
        // v2 file format, each entry is 12 bytes long
        qint64 time;
        for (int i = 0; i < tzh_leapcnt && ds.status() == QDataStream::Ok; ++i) {
            // Parse Leap Occurrence Time, 8 bytes
            ds >> time;
            // Parse Leap Seconds To Apply, 4 bytes
            if (ds.status() == QDataStream::Ok)
                ds >> val;
        }
    } else {
        // v0 file format, each entry is 8 bytes long
        for (int i = 0; i < tzh_leapcnt && ds.status() == QDataStream::Ok; ++i) {
            // Parse Leap Occurrence Time, 4 bytes
            ds >> val;
            // Parse Leap Seconds To Apply, 4 bytes
            if (ds.status() == QDataStream::Ok)
                ds >> val;
        }
    }
}